

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_restart.c
# Opt level: O1

PDHG_restart_choice PDHG_Check_Restart_GPU(CUPDLPwork *work)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  CUPDLPresobj *pCVar4;
  CUPDLPiterates *pCVar5;
  CUPDLPtimers *pCVar6;
  CUPDLPresobj *pCVar7;
  cupdlp_float *pcVar8;
  char *pcVar9;
  PDHG_restart_choice PVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pCVar4 = work->resobj;
  pCVar5 = work->iterates;
  pCVar6 = work->timers;
  if (pCVar6->nIter == pCVar5->iLastRestartIter) {
    pCVar4->dPrimalFeasLastRestart = pCVar4->dPrimalFeas;
    pCVar4->dDualFeasLastRestart = pCVar4->dDualFeas;
    pCVar4->dDualityGapLastRestart = pCVar4->dDualityGap;
    pCVar4->dPrimalFeasLastCandidate = pCVar4->dPrimalFeas;
    pCVar4->dDualFeasLastCandidate = pCVar4->dDualFeas;
    pCVar4->dDualityGapLastCandidate = pCVar4->dDualityGap;
    PVar10 = PDHG_NO_RESTART;
  }
  else {
    dVar11 = work->stepsize->dBeta;
    dVar11 = pCVar4->dDualityGap * pCVar4->dDualityGap +
             dVar11 * pCVar4->dPrimalFeas * pCVar4->dPrimalFeas +
             (pCVar4->dDualFeas * pCVar4->dDualFeas) / dVar11;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    pCVar7 = work->resobj;
    dVar12 = work->stepsize->dBeta;
    dVar12 = pCVar7->dDualityGapAverage * pCVar7->dDualityGapAverage +
             dVar12 * pCVar7->dPrimalFeasAverage * pCVar7->dPrimalFeasAverage +
             (pCVar7->dDualFeasAverage * pCVar7->dDualFeasAverage) / dVar12;
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    PVar10 = (dVar12 <= dVar11) + PDHG_RESTART_TO_CURRENT;
    iVar2 = pCVar6->nIter;
    if ((double)(iVar2 - pCVar5->iLastRestartIter) < (double)iVar2 * 0.36) {
      dVar13 = dVar11;
      if (dVar12 <= dVar11) {
        dVar13 = dVar12;
      }
      pCVar7 = work->resobj;
      dVar14 = work->stepsize->dBeta;
      dVar14 = pCVar7->dDualityGapLastRestart * pCVar7->dDualityGapLastRestart +
               dVar14 * pCVar7->dPrimalFeasLastRestart * pCVar7->dPrimalFeasLastRestart +
               (pCVar7->dDualFeasLastRestart * pCVar7->dDualFeasLastRestart) / dVar14;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      if (dVar14 * 0.2 <= dVar13) {
        pCVar7 = work->resobj;
        dVar1 = work->stepsize->dBeta;
        dVar1 = pCVar7->dDualityGapLastCandidate * pCVar7->dDualityGapLastCandidate +
                dVar1 * pCVar7->dPrimalFeasLastCandidate * pCVar7->dPrimalFeasLastCandidate +
                (pCVar7->dDualFeasLastCandidate * pCVar7->dDualFeasLastCandidate) / dVar1;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        if (dVar14 * 0.8 <= dVar13 || dVar13 <= dVar1) {
          PVar10 = PDHG_NO_RESTART;
        }
      }
    }
    if (dVar12 <= dVar11) {
      pCVar4->dPrimalFeasLastCandidate = pCVar4->dPrimalFeasAverage;
      pCVar4->dDualFeasLastCandidate = pCVar4->dDualFeasAverage;
      pcVar8 = &pCVar4->dDualityGapAverage;
    }
    else {
      pcVar8 = &pCVar4->dDualityGap;
      pCVar4->dPrimalFeasLastCandidate = pCVar4->dPrimalFeas;
      pCVar4->dDualFeasLastCandidate = pCVar4->dDualFeas;
    }
    pCVar4->dDualityGapLastCandidate = *pcVar8;
    if (PVar10 != PDHG_NO_RESTART) {
      iVar2 = work->settings->nLogLevel;
      if (dVar12 <= dVar11) {
        if (iVar2 < 2) {
          return PVar10;
        }
        uVar3 = pCVar5->iLastRestartIter;
        pcVar9 = "average\n";
      }
      else {
        if (iVar2 < 2) {
          return PVar10;
        }
        uVar3 = pCVar5->iLastRestartIter;
        pcVar9 = "current\n";
      }
      printf("Last restart was iter %d: %s",(ulong)uVar3,pcVar9);
    }
  }
  return PVar10;
}

Assistant:

PDHG_restart_choice PDHG_Check_Restart_GPU(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPtimers *timers = work->timers;

  // Is it first time called?
  if (timers->nIter == iterates->iLastRestartIter) {
    resobj->dPrimalFeasLastRestart = resobj->dPrimalFeas;
    resobj->dDualFeasLastRestart = resobj->dDualFeas;
    resobj->dDualityGapLastRestart = resobj->dDualityGap;

    resobj->dPrimalFeasLastCandidate = resobj->dPrimalFeas;
    resobj->dDualFeasLastCandidate = resobj->dDualFeas;
    resobj->dDualityGapLastCandidate = resobj->dDualityGap;

    return PDHG_NO_RESTART;
  }

  cupdlp_float muCurrent = PDHG_Restart_Score_GPU(
      work->stepsize->dBeta, work->resobj->dPrimalFeas, work->resobj->dDualFeas,
      work->resobj->dDualityGap);
  cupdlp_float muAverage = PDHG_Restart_Score_GPU(
      work->stepsize->dBeta, work->resobj->dPrimalFeasAverage,
      work->resobj->dDualFeasAverage, work->resobj->dDualityGapAverage);

  cupdlp_float muCandidate = 0.0;
  PDHG_restart_choice restart_choice = PDHG_RESTART_TO_AVERAGE;
  if (muCurrent < muAverage) {
    restart_choice = PDHG_RESTART_TO_CURRENT;
    muCandidate = muCurrent;
  } else {
    // restart_choice = PDHG_RESTART_TO_AVERAGE;
    muCandidate = muAverage;
  }

  // Or should we do artificial restart based on iteration count?
  // if (2 * (timers->nIter - iterates->iLastRestartIter) >= timers->nIter) {
  if ((timers->nIter - iterates->iLastRestartIter) >= 0.36 * timers->nIter) {
#if CUPDLP_DEBUG
    cupdlp_printf("Doing artificial restart.");
#endif
  } else {
    cupdlp_float muLastRestart = PDHG_Restart_Score_GPU(
        work->stepsize->dBeta, work->resobj->dPrimalFeasLastRestart,
        work->resobj->dDualFeasLastRestart,
        work->resobj->dDualityGapLastRestart);

    // Sufficient decay
    if (muCandidate < 0.2 * muLastRestart) {
#if CUPDLP_DEBUG
      cupdlp_printf("Doing sufficient restart.");
#endif
    } else {
      cupdlp_float muLastCandidate = PDHG_Restart_Score_GPU(
          work->stepsize->dBeta, work->resobj->dPrimalFeasLastCandidate,
          work->resobj->dDualFeasLastCandidate,
          work->resobj->dDualityGapLastCandidate);

      // Necessary decay
      if (muCandidate < 0.8 * muLastRestart && muCandidate > muLastCandidate) {
#if CUPDLP_DEBUG
        cupdlp_printf("Doing necessary restart.");
#endif
      } else {
        restart_choice = PDHG_NO_RESTART;
      }
    }
  }
  // record candidate
  if (muCurrent < muAverage) {
    resobj->dPrimalFeasLastCandidate = resobj->dPrimalFeas;
    resobj->dDualFeasLastCandidate = resobj->dDualFeas;
    resobj->dDualityGapLastCandidate = resobj->dDualityGap;
  } else {
    resobj->dPrimalFeasLastCandidate = resobj->dPrimalFeasAverage;
    resobj->dDualFeasLastCandidate = resobj->dDualFeasAverage;
    resobj->dDualityGapLastCandidate = resobj->dDualityGapAverage;
  }

  if (restart_choice != PDHG_NO_RESTART) {
    if (muCurrent < muAverage) {
        if (work->settings->nLogLevel > 1)
	  cupdlp_printf("Last restart was iter %d: %s", iterates->iLastRestartIter,
                    "current\n");
    } else {
        if (work->settings->nLogLevel > 1)
	  cupdlp_printf("Last restart was iter %d: %s", iterates->iLastRestartIter,
                    "average\n");
    }
  }
  return restart_choice;
}